

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::ParsedScene::WorldBegin(ParsedScene *this,FileLoc loc)

{
  Transform *__dest;
  mapped_type *__dest_00;
  void *__src;
  long in_RDI;
  int i;
  Transform *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  key_type *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined1 local_8c [128];
  int local_c;
  
  if (*(int *)(in_RDI + 0x860) == 2) {
    Error<char_const(&)[11]>
              ((FileLoc *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
               (char (*) [11])CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  else if (*(int *)(in_RDI + 0x860) == 1) {
    Error<char_const(&)[11]>
              ((FileLoc *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
               (char (*) [11])CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  else {
    *(undefined4 *)(in_RDI + 0x860) = 1;
    for (local_c = 0; local_c < 2; local_c = local_c + 1) {
      memset(local_8c,0,0x80);
      pbrt::Transform::Transform(in_stack_ffffffffffffff10);
      __dest = TransformSet::operator[]
                         ((TransformSet *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      memcpy(__dest,local_8c,0x80);
    }
    *(undefined4 *)(in_RDI + 0x964) = 3;
    __src = (void *)(in_RDI + 0x864);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    __dest_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
                              *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    memcpy(__dest_00,__src,0x100);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
  }
  return;
}

Assistant:

void ParsedScene::WorldBegin(FileLoc loc) {
    VERIFY_OPTIONS("WorldBegin");
    currentApiState = APIState::WorldBlock;
    for (int i = 0; i < MaxTransforms; ++i)
        curTransform[i] = pbrt::Transform();
    activeTransformBits = AllTransformsBits;
    namedCoordinateSystems["world"] = curTransform;
}